

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void reportPresolveReductions(HighsLogOptions *log_options,HighsLp *lp,HighsLp *presolve_lp)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  iVar1 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lp->num_col_];
  lVar5 = (long)presolve_lp->num_col_;
  if (lVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(uint)(presolve_lp->a_matrix_).start_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar5];
  }
  iVar3 = (int)uVar4;
  uVar2 = iVar1 - iVar3;
  if (iVar1 < iVar3) {
    uVar2 = -(iVar1 - iVar3);
  }
  highsLogUser(log_options,kInfo,
               "Presolve : Reductions: rows %d(-%d); columns %d(-%d); elements %d(%c%d)\n",
               (ulong)(uint)presolve_lp->num_row_,
               (ulong)(uint)(lp->num_row_ - presolve_lp->num_row_),lVar5,
               (ulong)(uint)(lp->num_col_ - presolve_lp->num_col_),uVar4,
               (ulong)((iVar3 <= iVar1) + 0x2b + (uint)(iVar3 <= iVar1)),(ulong)uVar2);
  return;
}

Assistant:

void reportPresolveReductions(const HighsLogOptions& log_options,
                              const HighsLp& lp, const HighsLp& presolve_lp) {
  HighsInt num_col_from = lp.num_col_;
  HighsInt num_row_from = lp.num_row_;
  HighsInt num_els_from = lp.a_matrix_.start_[num_col_from];
  HighsInt num_col_to = presolve_lp.num_col_;
  HighsInt num_row_to = presolve_lp.num_row_;
  HighsInt num_els_to;
  if (num_col_to) {
    num_els_to = presolve_lp.a_matrix_.start_[num_col_to];
  } else {
    num_els_to = 0;
  }
  char elemsignchar = '-';
  HighsInt elemdelta = num_els_from - num_els_to;
  if (num_els_from < num_els_to) {
    elemdelta = -elemdelta;
    elemsignchar = '+';
  }
  highsLogUser(
      log_options, HighsLogType::kInfo,
      "Presolve : Reductions: rows %" HIGHSINT_FORMAT "(-%" HIGHSINT_FORMAT
      "); columns %" HIGHSINT_FORMAT "(-%" HIGHSINT_FORMAT
      "); "
      "elements %" HIGHSINT_FORMAT "(%c%" HIGHSINT_FORMAT ")\n",
      num_row_to, (num_row_from - num_row_to), num_col_to,
      (num_col_from - num_col_to), num_els_to, elemsignchar, elemdelta);
}